

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

curl_socket_t Curl_getconnectinfo(SessionHandle *data,connectdata **connp)

{
  connectdata *pcVar1;
  ssize_t sVar2;
  uint uVar3;
  connectdata *c;
  char buf;
  connfind find;
  undefined1 local_41;
  connectdata *local_40;
  char local_38;
  
  pcVar1 = (data->state).lastconnect;
  uVar3 = 0xffffffff;
  if ((pcVar1 != (connectdata *)0x0) && (data->multi_easy != (Curl_multi *)0x0)) {
    local_38 = '\0';
    local_40 = pcVar1;
    Curl_conncache_foreach(data->multi_easy->conn_cache,&local_40,conn_is_conn);
    if (local_38 == '\0') {
      (data->state).lastconnect = (connectdata *)0x0;
    }
    else {
      if (connp != (connectdata **)0x0) {
        *connp = pcVar1;
      }
      if (pcVar1->ssl[0].use != true) {
        uVar3 = pcVar1->sock[0];
        sVar2 = recv(uVar3,&local_41,1,2);
        uVar3 = -(uint)(sVar2 == 0) | uVar3;
      }
    }
  }
  return uVar3;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct SessionHandle *data,
                                  struct connectdata **connp)
{
  curl_socket_t sockfd;

  DEBUGASSERT(data);

  /* this only works for an easy handle that has been used for
     curl_easy_perform()! */
  if(data->state.lastconnect && data->multi_easy) {
    struct connectdata *c = data->state.lastconnect;
    struct connfind find;
    find.tofind = data->state.lastconnect;
    find.found = FALSE;

    Curl_conncache_foreach(data->multi_easy->conn_cache, &find, conn_is_conn);

    if(!find.found) {
      data->state.lastconnect = NULL;
      return CURL_SOCKET_BAD;
    }

    if(connp)
      /* only store this if the caller cares for it */
      *connp = c;
    sockfd = c->sock[FIRSTSOCKET];
    /* we have a socket connected, let's determine if the server shut down */
    /* determine if ssl */
    if(c->ssl[FIRSTSOCKET].use) {
      /* use the SSL context */
      if(!Curl_ssl_check_cxn(c))
        return CURL_SOCKET_BAD;   /* FIN received */
    }
/* Minix 3.1 doesn't support any flags on recv; just assume socket is OK */
#ifdef MSG_PEEK
    else {
      /* use the socket */
      char buf;
      if(recv((RECV_TYPE_ARG1)c->sock[FIRSTSOCKET], (RECV_TYPE_ARG2)&buf,
              (RECV_TYPE_ARG3)1, (RECV_TYPE_ARG4)MSG_PEEK) == 0) {
        return CURL_SOCKET_BAD;   /* FIN received */
      }
    }
#endif
  }
  else
    return CURL_SOCKET_BAD;

  return sockfd;
}